

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_map.h
# Opt level: O3

char * __thiscall cppcms::impl::string_map::get(string_map *this,char *ckey)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  byte *pbVar5;
  byte bVar6;
  ulong uVar7;
  long *plVar8;
  uint uVar9;
  char *__s1;
  ulong uVar10;
  
  bVar6 = *ckey;
  if (bVar6 == 0) {
    uVar9 = 0;
  }
  else {
    pbVar5 = (byte *)(ckey + 1);
    uVar9 = 0;
    do {
      uVar9 = (uint)bVar6 + uVar9 * 0x10;
      uVar9 = uVar9 & 0xfffffff ^ uVar9 >> 0x18 & 0xfffffff0;
      bVar6 = *pbVar5;
      pbVar5 = pbVar5 + 1;
    } while (bVar6 != 0);
  }
  lVar1 = *(long *)(this + 0x10);
  uVar10 = (*(long *)(this + 0x18) - lVar1 >> 3) * -0x5555555555555555;
  uVar7 = (ulong)uVar9 % uVar10;
  __s1 = *(char **)(lVar1 + uVar7 * 0x18);
  if (__s1 != (char *)0x0) {
    plVar8 = (long *)(uVar7 * 0x18 + lVar1);
    do {
      if ((*(uint *)(plVar8 + 2) == uVar9) && (iVar4 = strcmp(__s1,ckey), iVar4 == 0)) {
        return (char *)plVar8[1];
      }
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar10;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = (long)((uVar7 << 0x20) + 0x100000000) >> 0x20;
      uVar7 = SUB168(auVar3 % auVar2,0);
      plVar8 = (long *)((long)SUB164(auVar3 % auVar2,0) * 0x18 + lVar1);
      __s1 = (char *)*plVar8;
    } while (__s1 != (char *)0x0);
  }
  return (char *)0x0;
}

Assistant:

char const *get(char const *ckey)
			{
				entry e(ckey);
				int pos = e.hash % data_.size();
				while(data_[pos].key && !(data_[pos] == e)) 
					pos = (pos + 1) % data_.size();
				if(data_[pos].key == 0)
					return 0;
				return data_[pos].value;
			}